

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint64_t farmhashxo::Hash64(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t in_R8;
  long lVar4;
  size_t len_00;
  
  if (0x20 < len) {
    if (len < 0x41) {
      len_00 = len * 2 + 0x9ae16a3b2f904031;
      uVar1 = H32(s,0x9ae16a3b2f904031,0,0,in_R8);
      uVar2 = H32(s + (len - 0x20),len_00,0,0,in_R8);
      lVar4 = uVar2 * len_00 + uVar1;
    }
    else {
      if (0x60 < len) {
        if (len < 0x101) {
          uVar1 = farmhashna::Hash64(s,len);
          return uVar1;
        }
        uVar1 = farmhashuo::Hash64(s,len);
        return uVar1;
      }
      len_00 = len * 2 + 0x9ae16a3b2f903fdd;
      uVar1 = H32(s,0x9ae16a3b2f903fdd,0,0,in_R8);
      uVar2 = H32(s + 0x20,len_00,0,0,in_R8);
      uVar3 = H32(s + (len - 0x20),len_00,uVar1,uVar2,in_R8);
      lVar4 = (uVar2 >> 0x15) + (uVar1 >> 0x11) + uVar3 * 9;
    }
    return lVar4 * len_00;
  }
  if (len < 0x11) {
    uVar1 = farmhashna::HashLen0to16(s,len);
    return uVar1;
  }
  uVar1 = farmhashna::HashLen17to32(s,len);
  return uVar1;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhashna::HashLen0to16(s, len);
    } else {
      return farmhashna::HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  } else if (len <= 96) {
    return HashLen65to96(s, len);
  } else if (len <= 256) {
    return farmhashna::Hash64(s, len);
  } else {
    return farmhashuo::Hash64(s, len);
  }
}